

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

bool __thiscall smf::MidiFile::readSmf(MidiFile *this,string *filename)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  istream local_230 [8];
  fstream input;
  string *filename_local;
  MidiFile *this_local;
  
  this->m_timemapvalid = false;
  setFilename(this,filename);
  this->m_rwstatus = true;
  std::fstream::fstream(local_230);
  _Var3 = std::__cxx11::string::c_str();
  std::operator|(_S_bin,_S_in);
  std::fstream::open((char *)local_230,_Var3);
  bVar1 = std::fstream::is_open();
  if ((bVar1 & 1) == 0) {
    this->m_rwstatus = false;
    bVar1 = this->m_rwstatus;
  }
  else {
    bVar2 = readSmf(this,local_230);
    this->m_rwstatus = bVar2;
    bVar1 = this->m_rwstatus;
  }
  this_local._7_1_ = (bool)(bVar1 & 1);
  std::fstream::~fstream(local_230);
  return this_local._7_1_;
}

Assistant:

bool MidiFile::readSmf(const std::string& filename) {
	m_timemapvalid = 0;
	setFilename(filename);
	m_rwstatus = true;

	std::fstream input;
	input.open(filename.c_str(), std::ios::binary | std::ios::in);

	if (!input.is_open()) {
		m_rwstatus = false;
		return m_rwstatus;
	}

	m_rwstatus = readSmf(input);
	return m_rwstatus;
}